

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.cpp
# Opt level: O0

bool burst::operator==(k_ary_search_set<int,_std::less<void>_> *set,initializer_list<int> *c)

{
  bool bVar1;
  const_iterator __first2;
  const_iterator __last2;
  const_iterator local_58;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_const_int_*>
  local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  pair<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_const_int_*>
  local_28;
  initializer_list<int> *local_18;
  initializer_list<int> *c_local;
  k_ary_search_set<int,_std::less<void>_> *set_local;
  
  local_18 = c;
  c_local = (initializer_list<int> *)set;
  local_30._M_current = (int *)k_ary_search_set<int,_std::less<void>_>::begin(set);
  local_38._M_current =
       (int *)k_ary_search_set<int,_std::less<void>_>::end
                        ((k_ary_search_set<int,_std::less<void>_> *)c_local);
  __first2 = std::initializer_list<int>::begin(local_18);
  __last2 = std::initializer_list<int>::end(local_18);
  local_28 = std::
             mismatch<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int_const*>
                       (local_30,local_38,__first2,__last2);
  local_50._M_current =
       (int *)k_ary_search_set<int,_std::less<void>_>::end
                        ((k_ary_search_set<int,_std::less<void>_> *)c_local);
  local_58 = std::initializer_list<int>::end(local_18);
  local_48 = std::
             make_pair<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int_const*>
                       (&local_50,&local_58);
  bVar1 = std::operator==(&local_28,&local_48);
  return bVar1;
}

Assistant:

bool operator == (const k_ary_search_set<Value, Compare> & set, const Collection & c)
    {
        return
            std::mismatch
            (
                set.begin(), set.end(),
                c.begin(), c.end()
            ) == std::make_pair(set.end(), c.end());
    }